

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.cpp
# Opt level: O1

shared_ptr<PolledShaderSource> __thiscall
Resources::getShaderSource(Resources *this,string *filename)

{
  size_type *this_00;
  int iVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  PolledShaderSource *this_01;
  mapped_type *pmVar4;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<PolledShaderSource> sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar1 = *(int *)&filename[2]._M_dataplus._M_p;
  *(int *)&filename[2]._M_dataplus._M_p = iVar1 + 1;
  if (iVar1 < 10) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                    *)&filename[2]._M_string_length,in_RDX);
    if (iVar3._M_node == (_Base_ptr)&filename[2].field_2) {
      this_01 = (PolledShaderSource *)operator_new(0xd0);
      getFile((Resources *)&stack0xffffffffffffffc0,filename);
      PolledShaderSource::PolledShaderSource
                (this_01,(Resources *)filename,(shared_ptr<PolledFile> *)&stack0xffffffffffffffc0);
      (this->project_root_)._M_pathname._M_dataplus._M_p = (pointer)this_01;
      this_00 = &(this->project_root_)._M_pathname._M_string_length;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<PolledShaderSource*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,this_01);
      if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
      }
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
                             *)&filename[2]._M_string_length,in_RDX);
      (pmVar4->super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)(this->project_root_)._M_pathname._M_dataplus._M_p;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pmVar4->super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
      _Var5._M_pi = extraout_RDX_01;
    }
    else {
      (this->project_root_)._M_pathname._M_dataplus._M_p = *(pointer *)(iVar3._M_node + 2);
      p_Var2 = iVar3._M_node[2]._M_parent;
      (this->project_root_)._M_pathname._M_string_length = (size_type)p_Var2;
      _Var5._M_pi = extraout_RDX_00;
      if (p_Var2 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        }
      }
    }
  }
  else {
    aAppDebugPrintf("Include is too deep at file %s",(in_RDX->_M_dataplus)._M_p);
    (this->project_root_)._M_pathname._M_dataplus._M_p = (pointer)0x0;
    (this->project_root_)._M_pathname._M_string_length = 0;
    _Var5._M_pi = extraout_RDX;
  }
  *(int *)&filename[2]._M_dataplus._M_p = *(int *)&filename[2]._M_dataplus._M_p + -1;
  sVar6.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<PolledShaderSource>)
         sVar6.super___shared_ptr<PolledShaderSource,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PolledShaderSource> Resources::getShaderSource(const std::string &filename) {
	struct AutoInc {
		int &i;
		AutoInc(int &i) : i(i) { ++i; }
		~AutoInc() { --i; }
	};

	const AutoInc include_inc(shader_include_guard_);
	if (shader_include_guard_ > 10) {
		MSG("Include is too deep at file %s", filename.c_str());
		return std::shared_ptr<PolledShaderSource>();
	}

	const auto it = shader_sources_.find(filename);
	if (it != shader_sources_.end())
		return it->second;

	const std::shared_ptr<PolledShaderSource> source(
		new PolledShaderSource(*this, getFile(filename)));
	shader_sources_[filename] = source;
	return source;
}